

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone::calculate_bind(xr_bone *this,fmatrix *parent_xform)

{
  bool bVar1;
  reference ppxVar2;
  __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
  local_28;
  xr_bone_vec_it end;
  xr_bone_vec_it it;
  fmatrix *parent_xform_local;
  xr_bone *this_local;
  
  _matrix<float>::set_xyz_i(&this->m_bind_xform,&this->m_bind_rotate);
  _vector3<float>::set<float>(&(this->m_bind_xform).field_0.field_1.c,&this->m_bind_offset);
  _matrix<float>::mul_a_43(&this->m_bind_xform,parent_xform);
  _matrix<float>::invert_43(&this->m_bind_i_xform,&this->m_bind_xform);
  end._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::begin
                 (&this->m_children);
  local_28._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::end(&this->m_children);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_28);
    if (!bVar1) break;
    ppxVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
              ::operator*(&end);
    calculate_bind(*ppxVar2,&this->m_bind_xform);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

void xr_bone::calculate_bind(const fmatrix& parent_xform)
{
	m_bind_xform.set_xyz_i(m_bind_rotate);
	m_bind_xform.c.set(m_bind_offset);
	m_bind_xform.mul_a_43(parent_xform);
	m_bind_i_xform.invert_43(m_bind_xform);

	for (xr_bone_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it)
		(*it)->calculate_bind(m_bind_xform);
}